

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::AssertionResult::hasExpandedExpression(AssertionResult *this)

{
  __type_conflict _Var1;
  bool bVar2;
  string sStack_58;
  string local_38;
  
  if (*(this->m_info).capturedExpression.m_start == '\0') {
    bVar2 = false;
  }
  else {
    getExpandedExpression_abi_cxx11_(&sStack_58,this);
    getExpression_abi_cxx11_(&local_38,this);
    _Var1 = std::operator==(&sStack_58,&local_38);
    bVar2 = !_Var1;
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&sStack_58);
  }
  return bVar2;
}

Assistant:

auto StringRef::operator[](size_type index) const noexcept -> char {
        return m_start[index];
    }